

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxu32 GenStateFixJumps(GenBlock *pBlock,sxi32 nJumpType,sxu32 nJumpDest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  SySet *pSVar5;
  ulong uVar6;
  
  pvVar4 = (pBlock->aJumpFix).pBase;
  uVar1 = (pBlock->aJumpFix).nUsed;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    iVar2 = *(int *)((long)pvVar4 + uVar6 * 8);
    if ((-1 < iVar2) && (nJumpType < 1 || iVar2 == nJumpType)) {
      uVar3 = *(uint *)((long)pvVar4 + uVar6 * 8 + 4);
      pSVar5 = pBlock->pGen->pVm->pByteContainer;
      if ((uVar3 < pSVar5->nUsed) && (pSVar5->pBase != (void *)0x0)) {
        *(sxu32 *)((long)pSVar5->pBase + (ulong)(uVar3 * pSVar5->eSize) + 8) = nJumpDest;
        *(undefined4 *)((long)pvVar4 + uVar6 * 8) = 0xffffffff;
      }
    }
  }
  return (sxu32)pvVar4;
}

Assistant:

static sxu32 GenStateFixJumps(GenBlock *pBlock, sxi32 nJumpType, sxu32 nJumpDest)
{
	JumpFixup *aFix;
	VmInstr *pInstr;
	sxu32 nFixed; 
	sxu32 n;
	/* Point to the jump fixup table */
	aFix = (JumpFixup *)SySetBasePtr(&pBlock->aJumpFix);
	/* Fix the desired jumps */
	for( nFixed = n = 0 ; n < SySetUsed(&pBlock->aJumpFix) ; ++n ){
		if( aFix[n].nJumpType < 0 ){
			/* Already fixed */
			continue;
		}
		if( nJumpType > 0 && aFix[n].nJumpType != nJumpType ){
			/* Not of our interest */
			continue;
		}
		/* Point to the instruction to fix */
		pInstr = jx9VmGetInstr(pBlock->pGen->pVm, aFix[n].nInstrIdx);
		if( pInstr ){
			pInstr->iP2 = nJumpDest;
			nFixed++;
			/* Mark as fixed */
			aFix[n].nJumpType = -1;
		}
	}
	/* Total number of fixed jumps */
	return nFixed;
}